

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irStatement * build_ir_forstmt(Context_conflict *ctx,MOJOSHADER_astForStatement *ast)

{
  int index;
  int iffalse;
  int index_00;
  int iftrue;
  LoopLabels *pLVar1;
  MOJOSHADER_irStatement *pMVar2;
  MOJOSHADER_irExpression *pMVar3;
  MOJOSHADER_irExpression *right;
  MOJOSHADER_irStatement *pMVar4;
  MOJOSHADER_irStatement *pMVar5;
  MOJOSHADER_irStatement *pMVar6;
  MOJOSHADER_irStatement *pMVar7;
  MOJOSHADER_irStatement *pMVar8;
  MOJOSHADER_irStatement *pMVar9;
  MOJOSHADER_irStatement *next;
  MOJOSHADER_irStatement *retval;
  MOJOSHADER_irStatement *init;
  int join;
  int increment;
  LoopLabels *labels;
  int loop;
  int test;
  MOJOSHADER_astForStatement *ast_local;
  Context_conflict *ctx_local;
  
  if (ast->looptest->datatype->type != MOJOSHADER_AST_DATATYPE_BOOL) {
    __assert_fail("ast->looptest->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1376,
                  "MOJOSHADER_irStatement *build_ir_forstmt(Context *, const MOJOSHADER_astForStatement *)"
                 );
  }
  index_00 = generate_ir_label(ctx);
  iftrue = generate_ir_label(ctx);
  pLVar1 = push_ir_loop(ctx,0);
  if (pLVar1 == (LoopLabels *)0x0) {
    ctx_local = (Context_conflict *)0x0;
  }
  else {
    index = pLVar1->start;
    iffalse = pLVar1->end;
    if (((ast->var_decl == (MOJOSHADER_astVariableDeclaration *)0x0) ||
        (ast->initializer != (MOJOSHADER_astExpression *)0x0)) &&
       ((ast->var_decl != (MOJOSHADER_astVariableDeclaration *)0x0 ||
        (ast->initializer == (MOJOSHADER_astExpression *)0x0)))) {
      __assert_fail("(ast->var_decl && !ast->initializer) || (!ast->var_decl && ast->initializer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x138f,
                    "MOJOSHADER_irStatement *build_ir_forstmt(Context *, const MOJOSHADER_astForStatement *)"
                   );
    }
    pMVar2 = new_ir_label(ctx,index_00);
    pMVar3 = build_ir_expr(ctx,ast->looptest);
    right = new_ir_constbool(ctx,1);
    pMVar4 = new_ir_cjump(ctx,MOJOSHADER_IR_COND_EQL,pMVar3,right,iftrue,iffalse);
    pMVar5 = new_ir_label(ctx,iftrue);
    pMVar6 = build_ir_stmt(ctx,ast->statement);
    pMVar7 = new_ir_label(ctx,index);
    pMVar3 = build_ir_expr(ctx,ast->counter);
    pMVar8 = new_ir_expr_stmt(ctx,pMVar3);
    pMVar9 = new_ir_jump(ctx,index_00);
    next = new_ir_label(ctx,iffalse);
    pMVar9 = new_ir_seq(ctx,pMVar9,next);
    pMVar8 = new_ir_seq(ctx,pMVar8,pMVar9);
    pMVar7 = new_ir_seq(ctx,pMVar7,pMVar8);
    pMVar6 = new_ir_seq(ctx,pMVar6,pMVar7);
    pMVar5 = new_ir_seq(ctx,pMVar5,pMVar6);
    pMVar4 = new_ir_seq(ctx,pMVar4,pMVar5);
    pMVar2 = new_ir_seq(ctx,pMVar2,pMVar4);
    pMVar2 = new_ir_seq(ctx,(MOJOSHADER_irStatement *)0x0,pMVar2);
    pop_ir_loop(ctx);
    pMVar4 = build_ir_stmt(ctx,ast->next);
    ctx_local = (Context_conflict *)new_ir_seq(ctx,pMVar2,pMVar4);
  }
  return (MOJOSHADER_irStatement *)ctx_local;
}

Assistant:

static MOJOSHADER_irStatement *build_ir_forstmt(Context *ctx,
                                       const MOJOSHADER_astForStatement *ast)
{
    // !!! FIXME: ast->unroll

    assert(ast->looptest->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);

    /* The gist...
            initializer  // (or var_decl->initializer!)
        test:
            cjump looptest == true, loop, join
        loop:
            statement
        increment:  // needs to be here; this is where "continue" jumps!
            counter
            jump test
        join:
    */

    const int test = generate_ir_label(ctx);
    const int loop = generate_ir_label(ctx);

    const LoopLabels *labels = push_ir_loop(ctx, 0);
    if (labels == NULL)
        return NULL;  // out of memory...

    const int increment = labels->start;
    const int join = labels->end;

    assert( (ast->var_decl && !ast->initializer) ||
            (!ast->var_decl && ast->initializer) );

    MOJOSHADER_irStatement *init = NULL;
    if (ast->var_decl != NULL)
    {
//sdfsdf
        // !!! FIXME: map the initializer to the variable? Need fix to var_decl parsing.
//        new_ir_move(ctx, FIXME MAP TO REGISTER ast->var_decl->index, build_ir_expr(ctx, ast->fsdf));
//        FIXME
//        init = build_ir_vardecl(ctx, ast->var_decl);
    } // if
    else
    {
//        init = build_ir_expr(ctx, ast->initializer);
    } // else

    MOJOSHADER_irStatement *retval =
        new_ir_seq(ctx, init,
        new_ir_seq(ctx, new_ir_label(ctx, test),
        new_ir_seq(ctx, new_ir_cjump(ctx, MOJOSHADER_IR_COND_EQL, build_ir_expr(ctx, ast->looptest), new_ir_constbool(ctx, 1), loop, join),
        new_ir_seq(ctx, new_ir_label(ctx, loop),
        new_ir_seq(ctx, build_ir_stmt(ctx, ast->statement),
        new_ir_seq(ctx, new_ir_label(ctx, increment),
        new_ir_seq(ctx, new_ir_expr_stmt(ctx, build_ir_expr(ctx, ast->counter)),
        new_ir_seq(ctx, new_ir_jump(ctx, test),
                        new_ir_label(ctx, join)))))))));

    pop_ir_loop(ctx);

    return new_ir_seq(ctx, retval, build_ir_stmt(ctx, ast->next));
}